

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O3

void __thiscall
LibGens::Ym2612Private::T_Update_Chan_LFO<4>
          (Ym2612Private *this,channel_t *CH,int32_t *bufL,int32_t *bufR,int length)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  
  if (0 < length && (CH->_SLOT[2].Ecnt != 0x20000000 || CH->_SLOT[3].Ecnt != 0x20000000)) {
    uVar22 = 0;
    do {
      iVar1 = CH->_SLOT[0].Fcnt;
      uVar2 = CH->_SLOT[1].Fcnt;
      iVar17 = CH->_SLOT[2].Fcnt;
      uVar14 = this->LFO_FREQ_UP[uVar22] * CH->FMS;
      if (uVar14 < 0x200) {
        iVar18 = CH->_SLOT[0].Finc + iVar1;
        iVar19 = CH->_SLOT[2].Finc + iVar17;
        iVar21 = CH->_SLOT[1].Finc + uVar2;
        iVar16 = CH->_SLOT[3].Finc;
      }
      else {
        iVar15 = (int)uVar14 >> 9;
        iVar16 = CH->_SLOT[0].Finc;
        iVar21 = CH->_SLOT[1].Finc;
        iVar18 = iVar16 + iVar1 + (iVar16 * iVar15 >> 9);
        iVar16 = CH->_SLOT[2].Finc;
        iVar19 = iVar16 + iVar17 + (iVar16 * iVar15 >> 9);
        iVar21 = (iVar21 * iVar15 >> 9) + uVar2 + iVar21;
        iVar16 = CH->_SLOT[3].Finc;
        iVar16 = (iVar15 * iVar16 >> 9) + iVar16;
      }
      iVar15 = CH->_SLOT[3].Fcnt;
      CH->_SLOT[0].Fcnt = iVar18;
      CH->_SLOT[2].Fcnt = iVar19;
      CH->_SLOT[1].Fcnt = iVar21;
      CH->_SLOT[3].Fcnt = iVar16 + iVar15;
      iVar16 = this->LFO_ENV_UP[uVar22];
      iVar21 = CH->_SLOT[0].TLL;
      iVar18 = CH->_SLOT[0].Ecnt;
      iVar19 = *(int *)(ENV_TAB + (long)(iVar18 >> 0x10) * 4);
      iVar9 = CH->_SLOT[0].AMS;
      iVar20 = CH->_SLOT[2].Ecnt;
      iVar3 = CH->_SLOT[2].TLL;
      iVar10 = CH->_SLOT[2].AMS;
      iVar4 = *(int *)(ENV_TAB + (long)(iVar20 >> 0x10) * 4);
      iVar5 = CH->_SLOT[1].TLL;
      iVar6 = *(int *)(ENV_TAB + (long)*(short *)((long)&CH->_SLOT[1].Ecnt + 2) * 4);
      iVar11 = CH->_SLOT[1].AMS;
      iVar7 = CH->_SLOT[3].TLL;
      iVar12 = CH->_SLOT[3].AMS;
      iVar8 = *(int *)(ENV_TAB + (long)*(short *)((long)&CH->_SLOT[3].Ecnt + 2) * 4);
      iVar18 = iVar18 + CH->_SLOT[0].Einc;
      CH->_SLOT[0].Ecnt = iVar18;
      if (CH->_SLOT[0].Ecmp <= iVar18) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[0].Ecurp * 8))(CH->_SLOT);
        iVar20 = CH->_SLOT[2].Ecnt;
      }
      iVar20 = iVar20 + CH->_SLOT[2].Einc;
      CH->_SLOT[2].Ecnt = iVar20;
      if (CH->_SLOT[2].Ecmp <= iVar20) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[2].Ecurp * 8))(CH->_SLOT + 2);
      }
      iVar18 = CH->_SLOT[1].Ecnt + CH->_SLOT[1].Einc;
      CH->_SLOT[1].Ecnt = iVar18;
      if (CH->_SLOT[1].Ecmp <= iVar18) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[1].Ecurp * 8))(CH->_SLOT + 1);
      }
      iVar18 = CH->_SLOT[3].Ecnt + CH->_SLOT[3].Einc;
      CH->_SLOT[3].Ecnt = iVar18;
      if (CH->_SLOT[3].Ecmp <= iVar18) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[3].Ecurp * 8))(CH->_SLOT + 3);
      }
      iVar18 = CH->S0_OUT[0];
      iVar20 = CH->S0_OUT[1];
      iVar13 = CH->FB;
      CH->S0_OUT[1] = iVar18;
      iVar1 = *(int *)(*(long *)(SIN_TAB +
                                ((uint)((iVar20 + iVar18 >> ((byte)iVar13 & 0x1f)) + iVar1) >> 0xb &
                                0x7ff8)) +
                      (long)(iVar21 + iVar19 + (iVar16 >> ((byte)iVar9 & 0x1f))) * 4);
      CH->S0_OUT[0] = iVar1;
      iVar17 = *(int *)(*(long *)(SIN_TAB + ((uint)(iVar17 + iVar1) >> 0xb & 0x7ff8)) +
                       (long)(iVar3 + iVar4 + (iVar16 >> ((byte)iVar10 & 0x1f))) * 4) +
               *(int *)(*(long *)(SIN_TAB +
                                 ((uint)(iVar15 + *(int *)(*(long *)(SIN_TAB +
                                                                    (uVar2 >> 0xb & 0x7ff8)) +
                                                          (long)(iVar5 + iVar6 +
                                                                (iVar16 >> ((byte)iVar11 & 0x1f))) *
                                                          4)) >> 0xb & 0x7ff8)) +
                       (long)(iVar7 + iVar8 + (iVar16 >> ((byte)iVar12 & 0x1f))) * 4) >> 0xe;
      CH->OUTd = iVar17;
      iVar1 = LIMIT_CH_OUT;
      if ((LIMIT_CH_OUT < iVar17) ||
         (iVar1 = -LIMIT_CH_OUT, SBORROW4(iVar17,-LIMIT_CH_OUT) != iVar17 + LIMIT_CH_OUT < 0)) {
        iVar17 = iVar1;
        CH->OUTd = iVar17;
      }
      bufL[uVar22] = bufL[uVar22] + ((iVar17 * CH->PANVolumeL) / 0xffff & CH->LEFT);
      bufR[uVar22] = bufR[uVar22] + ((CH->PANVolumeR * CH->OUTd) / 0xffff & CH->RIGHT);
      uVar22 = uVar22 + 1;
    } while ((uint)length != uVar22);
  }
  return;
}

Assistant:

inline void Ym2612Private::T_Update_Chan_LFO(channel_t *CH, int32_t *bufL, int32_t *bufR, int length)
{
	// Check if the channel has reached the end of the update.
	{
		int not_end = (CH->_SLOT[S3].Ecnt - ENV_END);

		// Special cases.
		// Copied from Game_Music_Emu v0.5.2.
		if (algo == 7)
			not_end |= (CH->_SLOT[S0].Ecnt - ENV_END);
		if (algo >= 5)
			not_end |= (CH->_SLOT[S2].Ecnt - ENV_END);
		if (algo >= 4)
			not_end |= (CH->_SLOT[S1].Ecnt - ENV_END);

		if (not_end == 0)
			return;
	}

	int env_LFO, freq_LFO;

//	LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG2,
//		"Algo %d LFO len = %d", algo, length);

	for (int i = 0; i < length; i++) {
		int in0, in1, in2, in3;		// current phase calculation
		int en0, en1, en2, en3;		// current envelope calculation

		GET_CURRENT_PHASE();
		UPDATE_PHASE_LFO();
		GET_CURRENT_ENV_LFO();
		UPDATE_ENV();

		assert(algo >= 0 && algo <= 7);
		switch (algo) {
			case 0:
				DO_ALGO_0();
				break;
			case 1:
				DO_ALGO_1();
				break;
			case 2:
				DO_ALGO_2();
				break;
			case 3:
				DO_ALGO_3();
				break;
			case 4:
				DO_ALGO_4();
				break;
			case 5:
				DO_ALGO_5();
				break;
			case 6:
				DO_ALGO_6();
				break;
			case 7:
				DO_ALGO_7();
				break;
			default:
				break;
		}

		DO_OUTPUT();
	}
}